

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

JavascriptPromise *
Js::JavascriptPromise::InitializePromise_TTD
          (ScriptContext *scriptContext,uint32 status,bool isHandled,Var result,
          SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *resolveReactions
          ,SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *rejectReactions
          )

{
  code *pcVar1;
  ScriptContextInfo SVar2;
  NodeBase *pNVar3;
  JavascriptLibrary *this;
  bool bVar4;
  Recycler *alloc;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar5;
  undefined4 *puVar6;
  Type pSVar7;
  Type *ppJVar8;
  bool local_131;
  undefined1 local_f8 [8];
  JavascriptPromiseReactionPair pair;
  undefined1 auStack_e0 [6];
  bool hasReject;
  bool hasResolve;
  Iterator rejectIterator;
  Iterator resolveIterator;
  TrackAllocData local_b0;
  JavascriptPromise *local_88;
  JavascriptPromise *promise;
  JavascriptLibrary *library;
  Recycler *recycler;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *rejectReactions_local;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *resolveReactions_local;
  Var result_local;
  bool isHandled_local;
  ScriptContext *pSStack_50;
  uint32 status_local;
  ScriptContext *scriptContext_local;
  bool local_39;
  NodeBase **local_38;
  bool local_29;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_28;
  bool local_19;
  ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *local_18;
  bool local_9;
  
  recycler = (Recycler *)rejectReactions;
  rejectReactions_local = resolveReactions;
  resolveReactions_local =
       (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)result;
  result_local._3_1_ = isHandled;
  result_local._4_4_ = status;
  pSStack_50 = scriptContext;
  library = (JavascriptLibrary *)ScriptContext::GetRecycler(scriptContext);
  promise = (JavascriptPromise *)ScriptContext::GetLibrary(pSStack_50);
  local_88 = JavascriptLibrary::CreatePromise((JavascriptLibrary *)promise);
  SetStatus(local_88,(PromiseStatus)result_local._4_4_);
  if ((result_local._3_1_ & 1) != 0) {
    SetIsHandled(local_88);
  }
  Memory::WriteBarrierPtr<void>::operator=(&local_88->result,resolveReactions_local);
  this = library;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_b0,
             (type_info *)
             &SList<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x721);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_b0);
  pSVar5 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
           new<Memory::Recycler>(0x18,alloc,0x43c4b0);
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::SList
            (pSVar5,(Recycler *)library);
  Memory::WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>::
  operator=(&local_88->reactions,pSVar5);
  join_0x00000010_0x00000000_ =
       SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::GetIterator
                 (&rejectReactions_local->
                   super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                 );
  _auStack_e0 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::
                GetIterator((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                             *)recycler);
  local_18 = (ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
             &rejectIterator.current;
  if (resolveIterator.list ==
      (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pNVar3 = rejectIterator.current;
  pSVar7 = SListNodeBase<Memory::HeapAllocator>::Next
                     (&(resolveIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
  local_9 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::IsHead
                      ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                        *)pNVar3,pSVar7);
  if (!local_9) {
    SListNodeBase<Memory::HeapAllocator>::Next
              (&(resolveIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
  }
  local_9 = !local_9;
  pair.rejectReaction._7_1_ = local_9;
  local_28 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)auStack_e0;
  if (rejectIterator.list ==
      (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  SVar2._vptr_ScriptContextInfo = _auStack_e0;
  pSVar7 = SListNodeBase<Memory::HeapAllocator>::Next
                     (&(rejectIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
  local_19 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::IsHead
                       ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                         *)SVar2._vptr_ScriptContextInfo,pSVar7);
  if (!local_19) {
    SListNodeBase<Memory::HeapAllocator>::Next
              (&(rejectIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
  }
  local_19 = !local_19;
  pair.rejectReaction._6_1_ = local_19;
  while( true ) {
    local_131 = false;
    if ((pair.rejectReaction._7_1_ & 1) != 0) {
      local_131 = (bool)pair.rejectReaction._6_1_;
    }
    if (local_131 == false) break;
    ppJVar8 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Iterator
              ::Data((Iterator *)&rejectIterator.current);
    local_f8 = (undefined1  [8])*ppJVar8;
    ppJVar8 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Iterator
              ::Data((Iterator *)auStack_e0);
    pair.resolveReaction = *ppJVar8;
    pSVar5 = Memory::
             WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>
             ::operator->(&local_88->reactions);
    SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
              (pSVar5,(JavascriptPromiseReactionPair *)local_f8);
    local_38 = &rejectIterator.current;
    if (resolveIterator.list ==
        (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pNVar3 = rejectIterator.current;
    pSVar7 = SListNodeBase<Memory::HeapAllocator>::Next
                       (&(resolveIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
    bVar4 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::IsHead
                      ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                        *)pNVar3,pSVar7);
    if (!bVar4) {
      SListNodeBase<Memory::HeapAllocator>::Next
                (&(resolveIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
    }
    local_29 = !bVar4;
    pair.rejectReaction._7_1_ = local_29;
    scriptContext_local = (ScriptContext *)auStack_e0;
    if (rejectIterator.list ==
        (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    SVar2._vptr_ScriptContextInfo = _auStack_e0;
    pSVar7 = SListNodeBase<Memory::HeapAllocator>::Next
                       (&(rejectIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
    bVar4 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::IsHead
                      ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                        *)SVar2._vptr_ScriptContextInfo,pSVar7);
    if (!bVar4) {
      SListNodeBase<Memory::HeapAllocator>::Next
                (&(rejectIterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
    }
    local_39 = !bVar4;
    pair.rejectReaction._6_1_ = local_39;
  }
  if (((pair.rejectReaction._7_1_ & 1) != 0) || ((bool)pair.rejectReaction._6_1_ != false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x730,"(hasResolve == false && hasReject == false)",
                                "mismatched resolve/reject reaction counts");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar5 = Memory::
           WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>::
           operator->(&local_88->reactions);
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
            (&pSVar5->
              super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>);
  return local_88;
}

Assistant:

JavascriptPromise* JavascriptPromise::InitializePromise_TTD(ScriptContext* scriptContext, uint32 status, bool isHandled, Var result, SList<Js::JavascriptPromiseReaction*, HeapAllocator>& resolveReactions,SList<Js::JavascriptPromiseReaction*, HeapAllocator>& rejectReactions)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromise* promise = library->CreatePromise();

        promise->SetStatus((PromiseStatus)status);
        if (isHandled)
        {
            promise->SetIsHandled();
        }
        promise->result = result;

        promise->reactions = RecyclerNew(recycler, JavascriptPromiseReactionList, recycler);
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator resolveIterator = resolveReactions.GetIterator();
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator rejectIterator = rejectReactions.GetIterator();

        bool hasResolve = resolveIterator.Next();
        bool hasReject = rejectIterator.Next();
        while (hasResolve && hasReject)
        {
            JavascriptPromiseReactionPair pair;
            pair.resolveReaction = resolveIterator.Data();
            pair.rejectReaction = rejectIterator.Data();
            promise->reactions->Prepend(pair);
            hasResolve = resolveIterator.Next();
            hasReject = rejectIterator.Next();
        }
        AssertMsg(hasResolve == false && hasReject == false, "mismatched resolve/reject reaction counts");
        promise->reactions->Reverse();

        return promise;
    }